

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O2

void duckdb::StandardLeastGreatest<false>::FinalizeResult
               (idx_t rows,bool *result_has_value,Vector *result,ExpressionState *param_4)

{
  idx_t i;
  idx_t row_idx;
  
  FlatVector::VerifyFlatVector(result);
  for (row_idx = 0; rows != row_idx; row_idx = row_idx + 1) {
    if (result_has_value[row_idx] == false) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
    }
  }
  return;
}

Assistant:

static void FinalizeResult(idx_t rows, bool result_has_value[], Vector &result, ExpressionState &) {
		auto &result_mask = FlatVector::Validity(result);
		for (idx_t i = 0; i < rows; i++) {
			if (!result_has_value[i]) {
				result_mask.SetInvalid(i);
			}
		}
	}